

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O2

string * __thiscall
cmUuid::BinaryToString_abi_cxx11_(string *__return_storage_ptr__,cmUuid *this,uchar *input)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar4 = 0;
  lVar2 = 0;
  do {
    if (lVar4 != 0) {
      if (lVar4 == 5) {
        return __return_storage_ptr__;
      }
      this = (cmUuid *)0x2d;
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    iVar1 = kUuidGroups._M_elems[lVar4];
    for (lVar3 = 0; iVar1 != lVar3; lVar3 = lVar3 + 1) {
      ByteToHex_abi_cxx11_(&local_50,this,input[lVar3 + lVar2]);
      this = (cmUuid *)&local_50;
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
    }
    lVar4 = lVar4 + 1;
    lVar2 = lVar2 + iVar1;
  } while( true );
}

Assistant:

std::string cmUuid::BinaryToString(const unsigned char* input) const
{
  std::string output;

  size_t inputIndex = 0;
  for (size_t i = 0; i < kUuidGroups.size(); ++i) {
    if (i != 0) {
      output += '-';
    }

    size_t bytes = kUuidGroups[i];
    for (size_t j = 0; j < bytes; ++j) {
      unsigned char byte = input[inputIndex++];
      output += this->ByteToHex(byte);
    }
  }

  return output;
}